

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::Beta_I<double>(double x,double p,double q,double norm)

{
  bool bVar1;
  int *piVar2;
  double *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  int s;
  double temp;
  double rx;
  double y;
  double i;
  double term;
  bool flag;
  double cx;
  double psq;
  double eps;
  double local_98;
  int local_74;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_28 = (double)CONCAT44(in_XMM3_Db,in_XMM3_Da);
  if ((((in_XMM1_Qa <= 0.0) || (in_XMM2_Qa <= 0.0)) || (in_XMM0_Qa < 0.0)) || (1.0 < in_XMM0_Qa)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    local_20 = in_XMM2_Qa;
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    local_30 = Catch::clara::std::numeric_limits<double>::epsilon();
    local_30 = local_30 * 4.0;
    local_38 = local_18 + local_20;
    local_40 = 1.0 - local_10;
    bVar1 = local_18 < local_38 * local_10;
    if (bVar1) {
      utility::swap<double>(&local_10,&local_40);
      in_RDI = &local_18;
      utility::swap<double>(in_RDI,&local_20);
    }
    local_50 = 1.0;
    local_58 = 1.0;
    local_60 = 1.0;
    local_68 = local_10 / local_40;
    local_70 = local_20 - 1.0;
    local_74 = (int)(local_40 * local_38 + local_20);
    if (local_74 == 0) {
      local_68 = local_10;
    }
    while( true ) {
      local_50 = ((local_70 * local_68) / (local_18 + local_58)) * local_50;
      local_60 = local_50 + local_60;
      Catch::clara::std::abs((int)in_RDI);
      dVar5 = local_18;
      if ((extraout_XMM0_Qa <= 8.881784197001252e-16) &&
         (extraout_XMM0_Qa <= local_60 * 8.881784197001252e-16)) break;
      local_58 = local_58 + 1.0;
      local_74 = local_74 + -1;
      if (local_74 < 0) {
        local_70 = local_38;
        local_38 = local_38 + 1.0;
      }
      else {
        local_70 = local_20 - local_58;
        if (local_74 == 0) {
          local_68 = local_10;
        }
      }
    }
    dVar3 = ln(1.71692851399421e-317);
    dVar4 = ln(1.71694877068569e-317);
    dVar5 = exp(dVar5 * dVar3 + (local_20 - 1.0) * dVar4);
    local_98 = ((dVar5 / local_18) / local_28) * local_60;
    if (bVar1) {
      local_98 = 1.0 - local_98;
    }
    local_8 = local_98;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }